

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  LogFinisher local_fa;
  byte local_f9;
  LogMessage local_f8;
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  Extension *local_30;
  Extension *extension;
  MessageLite *message_local;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)message;
  message_local = (MessageLite *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_10 = this;
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
  }
  else {
    bVar1 = MaybeNewExtension(this,number,descriptor,&local_30);
    if (bVar1) {
      local_30->type = descriptor_local._3_1_;
      CVar2 = anon_unknown_0::cpp_type(local_30->type);
      local_69 = 0;
      if (CVar2 != CPPTYPE_MESSAGE) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                   ,0x1ef);
        local_69 = 1;
        pLVar3 = LogMessage::operator<<
                           (&local_68,
                            "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                           );
        LogFinisher::operator=(local_7d,pLVar3);
      }
      if ((local_69 & 1) != 0) {
        LogMessage::~LogMessage(&local_68);
      }
      local_30->is_repeated = false;
      local_30->field_0xa = local_30->field_0xa & 0xf;
      (local_30->field_0).string_value = (string *)extension;
    }
    else {
      local_b9 = 0;
      if ((local_30->is_repeated & 1U) != 0) {
        LogMessage::LogMessage
                  (&local_b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                   ,500);
        local_b9 = 1;
        pLVar3 = LogMessage::operator<<
                           (&local_b8,
                            "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                           );
        LogFinisher::operator=(&local_ba,pLVar3);
      }
      if ((local_b9 & 1) != 0) {
        LogMessage::~LogMessage(&local_b8);
      }
      CVar2 = anon_unknown_0::cpp_type(local_30->type);
      local_f9 = 0;
      if (CVar2 != CPPTYPE_MESSAGE) {
        LogMessage::LogMessage
                  (&local_f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                   ,500);
        local_f9 = 1;
        pLVar3 = LogMessage::operator<<
                           (&local_f8,
                            "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                           );
        LogFinisher::operator=(&local_fa,pLVar3);
      }
      if ((local_f9 & 1) != 0) {
        LogMessage::~LogMessage(&local_f8);
      }
      if (((byte)local_30->field_0xa >> 4 & 1) == 0) {
        if ((local_30->field_0).repeated_int32_value != (RepeatedField<int> *)0x0) {
          (**(code **)(((local_30->field_0).repeated_int32_value)->elements_ + 2))();
        }
        (local_30->field_0).string_value = (string *)extension;
      }
      else {
        (**(code **)(((local_30->field_0).repeated_int32_value)->elements_ + 10))
                  ((local_30->field_0).repeated_int32_value,extension);
      }
    }
    local_30->field_0xa = local_30->field_0xa & 0xf0;
  }
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = message;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message);
    } else {
      delete extension->message_value;
      extension->message_value = message;
    }
  }
  extension->is_cleared = false;
}